

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

bool __thiscall crnlib::dynamic_string::set_len(dynamic_string *this,uint new_len,char fill_char)

{
  ushort uVar1;
  uint uVar2;
  
  if (fill_char != '\0' && new_len < 0xffff) {
    uVar1 = this->m_len;
    if (this->m_buf_size <= new_len) {
      expand_buf(this,new_len + 1,true);
    }
    if (new_len < this->m_buf_size) {
      uVar2 = new_len - uVar1;
      if (uVar1 <= new_len && uVar2 != 0) {
        memset(this->m_pStr + uVar1,(uint)(byte)fill_char,(ulong)uVar2);
      }
      this->m_pStr[new_len] = '\0';
      this->m_len = (uint16)new_len;
    }
  }
  return fill_char != '\0' && new_len < 0xffff;
}

Assistant:

bool dynamic_string::set_len(uint new_len, char fill_char) {
  if ((new_len >= cUINT16_MAX) || (!fill_char)) {
    CRNLIB_ASSERT(0);
    return false;
  }

  uint cur_len = m_len;

  if (ensure_buf(new_len, true)) {
    if (new_len > cur_len)
      memset(m_pStr + cur_len, fill_char, new_len - cur_len);

    m_pStr[new_len] = 0;

    m_len = static_cast<uint16>(new_len);

    check();
  }

  return true;
}